

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

char * Scl_LibertyReadCellLeakage(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  Scl_Item_t *pSVar3;
  char *pcVar4;
  int *piVar5;
  int *piVar6;
  
  piVar5 = &pCell->Child;
  piVar6 = piVar5;
  while (pSVar2 = Scl_LibertyItem(p,*piVar6), pSVar2 != (Scl_Item_t *)0x0) {
    iVar1 = Scl_LibertyCompare(p,pSVar2->Key,"cell_leakage_power");
    if (iVar1 == 0) {
LAB_003b2081:
      pcVar4 = Scl_LibertyReadString(p,pSVar2->Head);
      return pcVar4;
    }
    piVar6 = &pSVar2->Next;
  }
  do {
    pSVar3 = Scl_LibertyItem(p,*piVar5);
    if (pSVar3 == (Scl_Item_t *)0x0) {
      return (char *)0x0;
    }
    iVar1 = Scl_LibertyCompare(p,pSVar3->Key,"leakage_power");
    if (iVar1 == 0) {
      piVar6 = &pSVar3->Child;
      piVar5 = piVar6;
      do {
        pSVar2 = Scl_LibertyItem(p,*piVar5);
        if (pSVar2 == (Scl_Item_t *)0x0) goto LAB_003b2068;
        iVar1 = Scl_LibertyCompare(p,pSVar2->Key,"when");
        piVar5 = &pSVar2->Next;
      } while (iVar1 != 0);
    }
LAB_003b2078:
    piVar5 = &pSVar3->Next;
  } while( true );
LAB_003b2068:
  pSVar2 = Scl_LibertyItem(p,*piVar6);
  if (pSVar2 == (Scl_Item_t *)0x0) goto LAB_003b2078;
  iVar1 = Scl_LibertyCompare(p,pSVar2->Key,"value");
  if (iVar1 == 0) goto LAB_003b2081;
  piVar6 = &pSVar2->Next;
  goto LAB_003b2068;
}

Assistant:

char * Scl_LibertyReadCellLeakage( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pItem, * pChild;
    Scl_ItemForEachChildName( p, pCell, pItem, "cell_leakage_power" )
        return Scl_LibertyReadString(p, pItem->Head);
    // look for another type
    Scl_ItemForEachChildName( p, pCell, pItem, "leakage_power" )
    {
        Scl_ItemForEachChildName( p, pItem, pChild, "when" )
            break;
        if ( pChild && !Scl_LibertyCompare(p, pChild->Key, "when") )
            continue;
        Scl_ItemForEachChildName( p, pItem, pChild, "value" )
            return Scl_LibertyReadString(p, pChild->Head);
    }
    return 0;
}